

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O1

int genxCharClass(genxWriter w,int c)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  if (c < 0) {
    bVar3 = false;
  }
  else if (c < 0x10000) {
    bVar3 = w->xmlChars[(uint)c] != '\0';
  }
  else {
    bVar3 = c < 0x110000;
  }
  bVar5 = true;
  bVar4 = true;
  if ((uint)c < 0x10000) {
    bVar4 = (w->xmlChars[(uint)c] & 4U) == 0;
    bVar5 = (w->xmlChars[(uint)c] & 2U) == 0;
  }
  uVar1 = bVar3 + 4;
  if (bVar4) {
    uVar1 = (uint)bVar3;
  }
  uVar2 = uVar1 + 2;
  if (bVar5) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

int genxCharClass(genxWriter w, int c)
{
  int ret = 0;

  if (isXMLChar(w, c))
    ret |= GENX_XML_CHAR;
  if (isNameChar(w, c))
    ret |= GENX_NAMECHAR;
  if (isLetter(w, c))
    ret |= GENX_LETTER;
  return ret;
}